

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

Result<unsigned_int> * __thiscall
vkb::Device::get_dedicated_queue_index
          (Result<unsigned_int> *__return_storage_ptr__,Device *this,QueueType type)

{
  bool bVar1;
  uint32_t uVar2;
  
  if (type == transfer) {
    uVar2 = detail::get_dedicated_queue_index(&this->queue_families,4,2);
    if (uVar2 != 0xffffffff) {
LAB_00108b60:
      (__return_storage_ptr__->field_0).m_value = uVar2;
      bVar1 = true;
      goto LAB_00108b85;
    }
    (__return_storage_ptr__->field_0).m_value = 3;
  }
  else if (type == compute) {
    uVar2 = detail::get_dedicated_queue_index(&this->queue_families,2,4);
    if (uVar2 != 0xffffffff) goto LAB_00108b60;
    (__return_storage_ptr__->field_0).m_value = 2;
  }
  else {
    (__return_storage_ptr__->field_0).m_value = 5;
  }
  *(undefined8 **)((long)&__return_storage_ptr__->field_0 + 8) = &detail::queue_error_category;
  (__return_storage_ptr__->field_0).m_error.vk_result = VK_SUCCESS;
  bVar1 = false;
LAB_00108b85:
  __return_storage_ptr__->m_init = bVar1;
  return __return_storage_ptr__;
}

Assistant:

Result<uint32_t> Device::get_dedicated_queue_index(QueueType type) const {
    uint32_t index = detail::QUEUE_INDEX_MAX_VALUE;
    switch (type) {
        case QueueType::compute:
            index = detail::get_dedicated_queue_index(queue_families, VK_QUEUE_COMPUTE_BIT, VK_QUEUE_TRANSFER_BIT);
            if (index == detail::QUEUE_INDEX_MAX_VALUE) return Result<uint32_t>{ QueueError::compute_unavailable };
            break;
        case QueueType::transfer:
            index = detail::get_dedicated_queue_index(queue_families, VK_QUEUE_TRANSFER_BIT, VK_QUEUE_COMPUTE_BIT);
            if (index == detail::QUEUE_INDEX_MAX_VALUE) return Result<uint32_t>{ QueueError::transfer_unavailable };
            break;
        default:
            return Result<uint32_t>{ QueueError::invalid_queue_family_index };
    }
    return index;
}